

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
::find_non_soo<google::protobuf::FileDescriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
           *this,key_arg<const_google::protobuf::FileDescriptor_*> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  key_arg<const_google::protobuf::FileDescriptor_*> pFVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  anon_union_8_1_a8a14541_for_iterator_2 aVar13;
  ulong uVar14;
  ctrl_t *pcVar15;
  __m128i match;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  iterator iVar23;
  char cVar18;
  char cVar20;
  char cVar21;
  char cVar22;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar10 = (hash >> 7 ^ uVar3 >> 0xc) & uVar2;
  aVar13.slot_ = (slot_type *)(hash & 0xffffffffffffff7f);
  pcVar15 = (ctrl_t *)(hash & 0x7f);
  auVar16 = ZEXT216(CONCAT11((char)pcVar15,(char)pcVar15));
  auVar16 = pshuflw(auVar16,auVar16,0);
  uVar11 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar10);
    cVar6 = pcVar1[0xf];
    cVar18 = auVar16[0];
    auVar19[0] = -(cVar18 == *pcVar1);
    cVar20 = auVar16[1];
    auVar19[1] = -(cVar20 == pcVar1[1]);
    cVar21 = auVar16[2];
    auVar19[2] = -(cVar21 == pcVar1[2]);
    cVar22 = auVar16[3];
    auVar19[3] = -(cVar22 == pcVar1[3]);
    auVar19[4] = -(cVar18 == pcVar1[4]);
    auVar19[5] = -(cVar20 == pcVar1[5]);
    auVar19[6] = -(cVar21 == pcVar1[6]);
    auVar19[7] = -(cVar22 == pcVar1[7]);
    auVar19[8] = -(cVar18 == pcVar1[8]);
    auVar19[9] = -(cVar20 == pcVar1[9]);
    auVar19[10] = -(cVar21 == pcVar1[10]);
    auVar19[0xb] = -(cVar22 == pcVar1[0xb]);
    auVar19[0xc] = -(cVar18 == pcVar1[0xc]);
    auVar19[0xd] = -(cVar20 == pcVar1[0xd]);
    auVar19[0xe] = -(cVar21 == pcVar1[0xe]);
    auVar19[0xf] = -(cVar22 == cVar6);
    uVar9 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    uVar8 = (uint)uVar9;
    while (uVar9 != 0) {
      uVar5 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar14 = uVar5 + uVar10 & uVar2;
      lVar12 = uVar14 * 0x20;
      pFVar4 = *(key_arg<const_google::protobuf::FileDescriptor_*> *)
                (*(long *)(this + 0x18) + lVar12);
      if (pFVar4 == *key) {
        if (uVar3 == 0) {
          __assert_fail("ctrl != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x9c4,
                        "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                       );
        }
        aVar13.slot_ = (slot_type *)(lVar12 + *(long *)(this + 0x18));
        pcVar15 = (ctrl_t *)(uVar14 + uVar3);
      }
      if (pFVar4 == *key) break;
      uVar9 = (ushort)(uVar8 - 1) & (ushort)uVar8;
      uVar8 = CONCAT22((short)(uVar8 - 1 >> 0x10),uVar9);
    }
    if (uVar9 != 0) {
LAB_0020c890:
      bVar7 = false;
      uVar14 = uVar11;
    }
    else {
      auVar17[0] = -(*pcVar1 == -0x80);
      auVar17[1] = -(pcVar1[1] == -0x80);
      auVar17[2] = -(pcVar1[2] == -0x80);
      auVar17[3] = -(pcVar1[3] == -0x80);
      auVar17[4] = -(pcVar1[4] == -0x80);
      auVar17[5] = -(pcVar1[5] == -0x80);
      auVar17[6] = -(pcVar1[6] == -0x80);
      auVar17[7] = -(pcVar1[7] == -0x80);
      auVar17[8] = -(pcVar1[8] == -0x80);
      auVar17[9] = -(pcVar1[9] == -0x80);
      auVar17[10] = -(pcVar1[10] == -0x80);
      auVar17[0xb] = -(pcVar1[0xb] == -0x80);
      auVar17[0xc] = -(pcVar1[0xc] == -0x80);
      auVar17[0xd] = -(pcVar1[0xd] == -0x80);
      auVar17[0xe] = -(pcVar1[0xe] == -0x80);
      auVar17[0xf] = -(cVar6 == -0x80);
      if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar6 == -0x80) {
        pcVar15 = (ctrl_t *)0x0;
        goto LAB_0020c890;
      }
      uVar14 = uVar11 + 0x10;
      if (uVar2 < uVar14) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xdbd,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>, K = const google::protobuf::FileDescriptor *]"
                     );
      }
      uVar10 = uVar10 + uVar11 + 0x10 & uVar2;
      bVar7 = true;
    }
    uVar11 = uVar14;
    if (!bVar7) {
      iVar23.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_2)
           (anon_union_8_1_a8a14541_for_iterator_2)aVar13.slot_;
      iVar23.ctrl_ = pcVar15;
      return iVar23;
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }